

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O3

bool __thiscall
HighsLpRelaxation::computeDualProof
          (HighsLpRelaxation *this,HighsDomain *globaldomain,double upperbound,
          vector<int,_std::allocator<int>_> *inds,vector<double,_std::allocator<double>_> *vals,
          double *rhs,bool extractCliques)

{
  int iVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer piVar5;
  HighsMipSolver *pHVar6;
  iterator __position;
  iterator __position_00;
  HighsInt *pHVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double val;
  vector<double,_std::allocator<double>_> row_dual;
  double local_68;
  double local_60;
  int local_54;
  double local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  std::vector<double,_std::allocator<double>_>::vector
            (&local_48,&(this->lpsolver).solution_.row_dual);
  uVar8 = (ulong)(uint)(this->lpsolver).model_.lp_.num_row_;
  local_60 = upperbound;
  if (uVar8 == 0) {
    local_68 = 0.0;
  }
  else {
    pdVar3 = (this->lpsolver).model_.lp_.row_lower_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar4 = (this->lpsolver).model_.lp_.row_upper_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar10 = 0;
    local_68 = 0.0;
    do {
      dVar14 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar10];
      if (dVar14 <= 0.0) {
        if (dVar14 < 0.0) {
          dVar16 = pdVar4[uVar10];
          if (INFINITY <= dVar16) goto LAB_002abf22;
          goto LAB_002abec4;
        }
      }
      else {
        dVar16 = pdVar3[uVar10];
        if (dVar16 <= -INFINITY) {
LAB_002abf22:
          local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] = 0.0;
        }
        else {
LAB_002abec4:
          dVar14 = dVar14 * dVar16;
          dVar16 = local_60 - dVar14;
          local_68 = local_68 +
                     (local_60 - (dVar14 + dVar16)) + (-dVar14 - (dVar16 - (dVar14 + dVar16)));
          local_60 = dVar16;
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar8 != uVar10);
  }
  piVar5 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar5) {
    (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar5;
  }
  pdVar3 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pdVar3) {
    (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pdVar3;
  }
  std::vector<int,_std::allocator<int>_>::reserve(inds,(long)(this->lpsolver).model_.lp_.num_col_);
  std::vector<double,_std::allocator<double>_>::reserve
            (vals,(long)(this->lpsolver).model_.lp_.num_col_);
  local_54 = 0;
  if ((this->lpsolver).model_.lp_.num_col_ != 0) {
    do {
      lVar9 = (long)local_54;
      piVar5 = (this->lpsolver).model_.lp_.a_matrix_.start_.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      iVar1 = piVar5[lVar9];
      iVar2 = piVar5[lVar9 + 1];
      dVar14 = (this->lpsolver).model_.lp_.col_cost_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar9];
      if (iVar2 == iVar1) {
        local_50 = 0.0;
      }
      else {
        local_50 = 0.0;
        lVar11 = 0;
        dVar16 = dVar14;
        do {
          dVar13 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(this->lpsolver).model_.lp_.a_matrix_.index_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[iVar1 + lVar11]];
          if ((dVar13 != 0.0) || (dVar14 = dVar16, NAN(dVar13))) {
            dVar13 = dVar13 * (this->lpsolver).model_.lp_.a_matrix_.value_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[iVar1 + lVar11];
            dVar14 = dVar16 - dVar13;
            local_50 = local_50 +
                       (dVar16 - (dVar13 + dVar14)) + (-dVar13 - (dVar14 - (dVar13 + dVar14)));
          }
          lVar11 = lVar11 + 1;
          dVar16 = dVar14;
        } while (iVar2 - iVar1 != (int)lVar11);
      }
      local_50 = local_50 + dVar14;
      pHVar6 = this->mipsolver;
      if ((pHVar6->options_mip_->super_HighsOptionsStruct).small_matrix_value < ABS(local_50)) {
        dVar14 = ((pHVar6->mipdata_)._M_t.
                  super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                  .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
        if (ABS(local_50) <= dVar14) {
LAB_002ac0e0:
          if (0.0 <= local_50) {
            dVar14 = (globaldomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar9];
            if (-INFINITY < dVar14) goto LAB_002ac123;
          }
          else {
            dVar14 = (globaldomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar9];
            if (dVar14 < INFINITY) {
LAB_002ac123:
              dVar14 = local_50 * dVar14;
              dVar16 = local_60 - dVar14;
              local_68 = local_68 +
                         (local_60 - (dVar14 + dVar16)) + (-dVar14 - (dVar16 - (dVar14 + dVar16)));
              local_60 = dVar16;
              goto LAB_002ac1d7;
            }
          }
          bVar12 = false;
          goto LAB_002ac24f;
        }
        dVar16 = (globaldomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar9];
        dVar13 = (globaldomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar9];
        if (((dVar16 == dVar13) && (!NAN(dVar16) && !NAN(dVar13))) ||
           ((pHVar6->model_->integrality_).
            super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_start[lVar9] == kContinuous)) {
          dVar15 = (this->lpsolver).solution_.col_value.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar9];
          if (local_50 <= 0.0) {
            dVar15 = dVar13 - dVar15;
          }
          else {
            dVar15 = dVar15 - dVar16;
          }
          if (dVar15 <= dVar14) goto LAB_002ac0e0;
        }
        __position._M_current =
             (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)vals,__position,&local_50);
        }
        else {
          *__position._M_current = local_50;
          (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        __position_00._M_current =
             (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
        if (__position_00._M_current ==
            (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)inds,__position_00,&local_54);
        }
        else {
          *__position_00._M_current = local_54;
          (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = __position_00._M_current + 1;
        }
      }
LAB_002ac1d7:
      local_54 = local_54 + 1;
    } while (local_54 != (this->lpsolver).model_.lp_.num_col_);
  }
  *rhs = local_68 + local_60;
  pHVar7 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  HighsDomain::tightenCoefficients
            (globaldomain,pHVar7,
             (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (HighsInt)
             ((ulong)((long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pHVar7) >> 2),rhs);
  bVar12 = true;
  if (extractCliques) {
    pHVar7 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    HighsCliqueTable::extractCliquesFromCut
              (&((this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->cliquetable,
               this->mipsolver,pHVar7,
               (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (HighsInt)
               ((ulong)((long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)pHVar7) >> 2),*rhs);
  }
LAB_002ac24f:
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar12;
}

Assistant:

bool HighsLpRelaxation::computeDualProof(const HighsDomain& globaldomain,
                                         double upperbound,
                                         std::vector<HighsInt>& inds,
                                         std::vector<double>& vals, double& rhs,
                                         bool extractCliques) const {
#if 0
  const HighsBasis& basis = lpsolver.getBasis();
  const HighsSolution& sol = lpsolver.getSolution();
  HighsCDouble proofRhs = upperbound;
  assert(lpsolver.getInfo().max_dual_infeasibility <=
         mipsolver.mipdata_->feastol);

  proofRhs -= lpsolver.getInfo().objective_function_value;
  inds.clear();
  vals.clear();
  double maxVal = 0.0;
  double maxValGlb = 0.0;
  double sumLocal = 0.0;
  HighsInt numLocalCols = 0;
  const HighsInt numCol = lpsolver.getNumCol();
  for (HighsInt i : mipsolver.mipdata_->integral_cols) {
    if (basis.col_status[i] == HighsBasisStatus::kBasic) continue;

    if (sol.col_dual[i] > kHighsTiny) {
      if (sol.col_value[i] != globaldomain.col_lower_[i]) {
        maxVal = std::max(sol.col_dual[i], maxVal);
        sumLocal += sol.col_dual[i];
        ++numLocalCols;
      }
    } else if (sol.col_dual[i] < -kHighsTiny) {
      if (sol.col_value[i] != globaldomain.col_upper_[i]) {
        maxVal = std::max(-sol.col_dual[i], maxVal);
        sumLocal += -sol.col_dual[i];
        ++numLocalCols;
      }
    } else
      continue;

    proofRhs += sol.col_value[i] * sol.col_dual[i];

    vals.push_back(sol.col_dual[i]);
    inds.push_back(i);
  }

  int expShift;
  std::frexp(maxVal - mipsolver.mipdata_->epsilon, &expShift);
  expShift = -expShift;

  HighsInt len = vals.size();

  double minGlbVal = numLocalCols == 0
                         ? 0.0
                         : std::ldexp(sumLocal / numLocalCols, expShift) -
                               mipsolver.mipdata_->feastol;

  for (HighsInt i = len - 1; i >= 0; --i) {
    HighsInt iCol = inds[i];
    double val = std::ldexp(vals[i], expShift);

    bool remove = false;

    double absVal = std::fabs(val);
    if (absVal <= mipsolver.mipdata_->feastol || globaldomain.isFixed(iCol)) {
      if (vals[i] > 0) {
        if (globaldomain.col_lower_[iCol] == -kHighsInf) return false;
        proofRhs -= vals[i] * globaldomain.col_lower_[iCol];
      } else {
        if (globaldomain.col_upper_[iCol] == kHighsInf) return false;
        proofRhs -= vals[i] * globaldomain.col_upper_[iCol];
      }

      remove = true;
    } else if (absVal < minGlbVal) {
      if (vals[i] > 0)
        remove = sol.col_value[iCol] == globaldomain.col_lower_[iCol];
      else
        remove = sol.col_value[iCol] == globaldomain.col_upper_[iCol];

      if (remove) proofRhs -= vals[i] * sol.col_value[iCol];
    }

    if (remove) {
      --len;
      vals[i] = vals[len];
      inds[i] = inds[len];
    } else {
      vals[i] = val;
    }
  }

  vals.resize(len);
  inds.resize(len);

  rhs = std::ldexp(double(proofRhs), expShift);

  globaldomain.tightenCoefficients(inds.data(), vals.data(), inds.size(), rhs);

  mipsolver.mipdata_->debugSolution.checkCut(inds.data(), vals.data(),
                                             inds.size(), rhs);
  if (extractCliques)
    mipsolver.mipdata_->cliquetable.extractCliquesFromCut(
        mipsolver, inds.data(), vals.data(), inds.size(), rhs);

  return true;
#else
  std::vector<double> row_dual = lpsolver.getSolution().row_dual;

  const HighsLp& lp = lpsolver.getLp();

  assert(std::isfinite(upperbound));
  HighsCDouble upper = upperbound;

  for (HighsInt i = 0; i != lp.num_row_; ++i) {
    // @FlipRowDual row_dual[i] < 0 became row_dual[i] > 0
    if (row_dual[i] > 0) {
      if (lp.row_lower_[i] != -kHighsInf)
        // @FlipRowDual += became -=
        upper -= row_dual[i] * lp.row_lower_[i];
      else
        row_dual[i] = 0;
      // @FlipRowDual row_dual[i] > 0 became row_dual[i] < 0
    } else if (row_dual[i] < 0) {
      if (lp.row_upper_[i] != kHighsInf)
        // @FlipRowDual += became -=
        upper -= row_dual[i] * lp.row_upper_[i];
      else
        row_dual[i] = 0;
    }
  }

  inds.clear();
  vals.clear();
  inds.reserve(lp.num_col_);
  vals.reserve(lp.num_col_);
  for (HighsInt i = 0; i != lp.num_col_; ++i) {
    HighsInt start = lp.a_matrix_.start_[i];
    HighsInt end = lp.a_matrix_.start_[i + 1];

    HighsCDouble sum = lp.col_cost_[i];

    for (HighsInt j = start; j != end; ++j) {
      if (row_dual[lp.a_matrix_.index_[j]] == 0) continue;
      // @FlipRowDual += became -=
      sum -= lp.a_matrix_.value_[j] * row_dual[lp.a_matrix_.index_[j]];
    }

    double val = double(sum);

    if (std::fabs(val) <= mipsolver.options_mip_->small_matrix_value) continue;

    bool removeValue = std::fabs(val) <= mipsolver.mipdata_->feastol;

    if (!removeValue &&
        (globaldomain.col_lower_[i] == globaldomain.col_upper_[i] ||
         mipsolver.variableType(i) == HighsVarType::kContinuous)) {
      if (val > 0)
        removeValue =
            lpsolver.getSolution().col_value[i] - globaldomain.col_lower_[i] <=
            mipsolver.mipdata_->feastol;
      else
        removeValue =
            globaldomain.col_upper_[i] - lpsolver.getSolution().col_value[i] <=
            mipsolver.mipdata_->feastol;
    }

    if (removeValue) {
      if (val < 0) {
        if (globaldomain.col_upper_[i] == kHighsInf) return false;
        upper -= val * globaldomain.col_upper_[i];
      } else {
        if (globaldomain.col_lower_[i] == -kHighsInf) return false;

        upper -= val * globaldomain.col_lower_[i];
      }

      continue;
    }

    vals.push_back(val);
    inds.push_back(i);
  }

  rhs = double(upper);
  assert(std::isfinite(rhs));
  globaldomain.tightenCoefficients(inds.data(), vals.data(), inds.size(), rhs);

  mipsolver.mipdata_->debugSolution.checkCut(inds.data(), vals.data(),
                                             inds.size(), rhs);
  if (extractCliques)
    mipsolver.mipdata_->cliquetable.extractCliquesFromCut(
        mipsolver, inds.data(), vals.data(), inds.size(), rhs);

  return true;
#endif
}